

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hr.cc
# Opt level: O3

string * __thiscall OB::Hr::repeat(string *__return_storage_ptr__,Hr *this,size_t len,string *str)

{
  ulong uVar1;
  long *local_40 [2];
  long local_30 [2];
  
  if ((len == 0) || (uVar1 = str->_M_string_length, uVar1 == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else if (uVar1 < len) {
    String::repeat(__return_storage_ptr__,len / uVar1,str);
    if (__return_storage_ptr__->_M_string_length <= len &&
        len != __return_storage_ptr__->_M_string_length) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)str);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40[0]);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Hr::repeat(std::size_t const len, std::string const& str) const
{
  if (len == 0 || str.empty())
  {
    return {};
  }


  if (str.size() >= len)
  {
    return str.substr(0, len);
  }

  std::string res {OB::String::repeat(len / str.size(), str)};

  if (res.size() < len)
  {
    res += str.substr(0, len - res.size());
  }

  return res;
}